

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrint.h
# Opt level: O0

vector<int,_std::allocator<int>_> *
cppqc::PrettyPrint<std::vector<int,std::allocator<int>>>::toString_abi_cxx11_
          (vector<int,_std::allocator<int>_> *x)

{
  vector<int,_std::allocator<int>_> *in_RDI;
  ostringstream out;
  ostringstream *this;
  ostringstream local_188 [392];
  
  this = local_188;
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)this,in_RDI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string toString(const T& x) {
    std::ostringstream out;
    out << x;
    return out.str();
  }